

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::SerializeGltfBufferData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *data,string *binFilename)

{
  byte bVar1;
  char *pcVar2;
  const_reference pvVar3;
  bool bVar4;
  char local_220 [8];
  ofstream output;
  string *binFilename_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_220,pcVar2,_S_bin);
  bVar1 = std::ofstream::is_open();
  bVar4 = (bVar1 & 1) != 0;
  if (bVar4) {
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](data,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data);
    std::ostream::write(local_220,(long)pvVar3);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_220);
  return bVar4;
}

Assistant:

static bool SerializeGltfBufferData(const std::vector<unsigned char> &data,
                                    const std::string &binFilename) {
  std::ofstream output(binFilename.c_str(), std::ofstream::binary);
  if (!output.is_open()) return false;
  output.write(reinterpret_cast<const char *>(&data[0]),
               std::streamsize(data.size()));
  output.close();
  return true;
}